

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Token __thiscall slang::parsing::Preprocessor::handleDirectives(Preprocessor *this,Token token)

{
  Info *pIVar1;
  uint uVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  bool bVar7;
  int iVar8;
  SyntaxKind SVar9;
  undefined4 extraout_var;
  long lVar10;
  SourceLocation SVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  EVP_PKEY_CTX *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  EVP_PKEY_CTX *src_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  SmallVector<slang::parsing::Token,_2UL> *pSVar12;
  SmallVector<slang::parsing::Token,_2UL> *args;
  BumpAllocator *alloc;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  SourceRange range;
  Trivia TVar13;
  string_view __x;
  Token TVar14;
  Token local_138;
  SmallVector<slang::parsing::Token,_2UL> tokens;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  Trivia local_40;
  
  pSVar12 = token._0_8_;
  trivia.super_SmallVectorBase<slang::parsing::Trivia>.data_ =
       (pointer)trivia.super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
  trivia.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
  trivia.super_SmallVectorBase<slang::parsing::Trivia>.cap = 8;
  args = pSVar12;
  local_138 = token;
LAB_001e3827:
  TVar14 = local_138;
  uVar2 = (uint)pSVar12 & 0xffff;
  if (uVar2 - 0x15a < 4) {
LAB_001e3839:
    tokens.super_SmallVectorBase<slang::parsing::Token>.len = 0;
    tokens.super_SmallVectorBase<slang::parsing::Token>.data_ =
         (pointer)tokens.super_SmallVectorBase<slang::parsing::Token>.firstElement;
    tokens.super_SmallVectorBase<slang::parsing::Token>.cap = 2;
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
              (&tokens.super_SmallVectorBase<slang::parsing::Token>,&local_138);
    iVar8 = SmallVectorBase<slang::parsing::Token>::copy
                      (&tokens.super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    tokens_00._M_ptr._4_4_ = extraout_var;
    tokens_00._M_ptr._0_4_ = iVar8;
    tokens_00._M_extent._M_extent_value = extraout_RDX._M_extent_value;
    Trivia::Trivia(&local_40,SkippedTokens,tokens_00);
    SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
              (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,&local_40);
    range = Token::range(&local_138);
    args = (SmallVector<slang::parsing::Token,_2UL> *)
           &std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_string.e_ident_class;
    addDiag(this,(DiagCode)0x100004,range);
    SmallVectorBase<slang::parsing::Token>::cleanup
              (&tokens.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)args);
LAB_001e38a5:
    local_138 = nextRaw(this);
    pSVar12 = local_138._0_8_;
    goto LAB_001e3827;
  }
  if (uVar2 == 0x157) {
    TVar3 = (this->lastConsumed).kind;
    uVar4 = (this->lastConsumed).field_0x2;
    NVar5.raw = (this->lastConsumed).numFlags.raw;
    uVar6 = (this->lastConsumed).rawLen;
    pIVar1 = (this->lastConsumed).info;
    (this->lastConsumed).kind = local_138.kind;
    (this->lastConsumed).field_0x2 = local_138._2_1_;
    (this->lastConsumed).numFlags = (NumericTokenFlags)local_138.numFlags.raw;
    (this->lastConsumed).rawLen = local_138.rawLen;
    (this->lastConsumed).info = local_138.info;
    local_138 = TVar14;
    SVar9 = Token::directiveKind(&local_138);
    if (SVar9 - DefaultDecayTimeDirective < 0x13) {
      lVar10 = (long)&switchD_001e3a08::switchdataD_0023e2cc +
               (long)(int)(&switchD_001e3a08::switchdataD_0023e2cc)
                          [SVar9 - DefaultDecayTimeDirective];
      switch(SVar9) {
      case DefaultDecayTimeDirective:
        TVar13 = handleDefaultDecayTimeDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      default:
switchD_001e3a4a_caseD_ab:
        SmallVectorBase<slang::parsing::Trivia>::cleanup
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)args);
        _Unwind_Resume(lVar10);
      case DefaultNetTypeDirective:
        TVar13 = handleDefaultNetTypeDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case DefaultTriregStrengthDirective:
        TVar13 = handleDefaultTriregStrengthDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case DefineDirective:
        TVar13 = handleDefineDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case DelayModeDistributedDirective:
      case DelayModePathDirective:
      case DelayModeUnitDirective:
      case DelayModeZeroDirective:
switchD_001e3a4a_caseD_b7:
        TVar13 = createSimpleDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
    }
    else if (SVar9 - ElseDirective < 0xf) {
      lVar10 = (long)&switchD_001e3a4a::switchdataD_0023e318 +
               (long)(int)(&switchD_001e3a4a::switchdataD_0023e318)[SVar9 - ElseDirective];
      switch(SVar9) {
      case ElseDirective:
        TVar13 = handleElseDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      default:
        goto switchD_001e3a4a_caseD_ab;
      case EndCellDefineDirective:
        TVar13 = handleEndCellDefineDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case EndIfDirective:
        TVar13 = handleEndIfDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case EndKeywordsDirective:
        TVar13 = handleEndKeywordsDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        break;
      case EndProtectDirective:
      case EndProtectedDirective:
        goto switchD_001e3a4a_caseD_b7;
      }
    }
    else if (SVar9 == BeginKeywordsDirective) {
      TVar13 = handleBeginKeywordsDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == CellDefineDirective) {
      TVar13 = handleCellDefineDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == ElsIfDirective) {
      TVar13 = handleElsIfDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == IfDefDirective) {
      TVar13 = handleIfDefDirective(this,local_138,false);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == IfNDefDirective) {
      TVar13 = handleIfDefDirective(this,local_138,true);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == IncludeDirective) {
      TVar13 = handleIncludeDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == LineDirective) {
      TVar13 = handleLineDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == MacroUsage) {
      handleMacroUsage((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)&tokens,this,
                       local_138);
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      if (tokens.super_SmallVectorBase<slang::parsing::Token>.firstElement[5] != '\0') {
        args = (SmallVector<slang::parsing::Token,_2UL> *)
               &tokens.super_SmallVectorBase<slang::parsing::Token>.cap;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)args);
      }
    }
    else if (SVar9 == NoUnconnectedDriveDirective) {
      TVar13 = handleNoUnconnectedDriveDirective(this,local_138);
      tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
    }
    else if (SVar9 == PragmaDirective) {
      handlePragmaDirective
                ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)&tokens,this,local_138);
      args = &tokens;
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      if (tokens.super_SmallVectorBase<slang::parsing::Token>.firstElement[5] != '\0') {
        args = (SmallVector<slang::parsing::Token,_2UL> *)
               &tokens.super_SmallVectorBase<slang::parsing::Token>.cap;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)args);
      }
    }
    else {
      if (SVar9 == ProtectDirective) goto switchD_001e3a4a_caseD_b7;
      if (SVar9 == ProtectedDirective) {
        handleProtectedDirective
                  ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)&tokens,this,local_138);
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
        if (tokens.super_SmallVectorBase<slang::parsing::Token>.firstElement[5] != '\0') {
          args = (SmallVector<slang::parsing::Token,_2UL> *)
                 &tokens.super_SmallVectorBase<slang::parsing::Token>.cap;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                    (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)args);
        }
      }
      else if (SVar9 == ResetAllDirective) {
        TVar13 = handleResetAllDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
      else if (SVar9 == TimeScaleDirective) {
        TVar13 = handleTimeScaleDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
      else if (SVar9 == UnconnectedDriveDirective) {
        TVar13 = handleUnconnectedDriveDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
      else if (SVar9 == UndefDirective) {
        TVar13 = handleUndefDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
      else {
        TVar13 = handleUndefineAllDirective(this,local_138);
        tokens.super_SmallVectorBase<slang::parsing::Token>._0_14_ = TVar13._0_14_;
        args = &tokens;
        SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                  (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&tokens);
      }
    }
    (this->lastConsumed).kind = TVar3;
    (this->lastConsumed).field_0x2 = uVar4;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar5.raw;
    (this->lastConsumed).rawLen = uVar6;
    (this->lastConsumed).info = pIVar1;
    goto LAB_001e38a5;
  }
  if (uVar2 == 0x15f) goto LAB_001e3839;
  if (((ulong)pSVar12 & 0xffff) != 0) {
    tokens.super_SmallVectorBase<slang::parsing::Token>._0_16_ = Token::trivia(&local_138);
    SmallVectorBase<slang::parsing::Trivia>::
    append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
              (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,
               (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&tokens);
    alloc = this->alloc;
    iVar8 = SmallVectorBase<slang::parsing::Trivia>::copy
                      (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc,
                       src_01);
    trivia_01._M_ptr._4_4_ = extraout_var_01;
    trivia_01._M_ptr._0_4_ = iVar8;
    trivia_01._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
    TVar14 = Token::withTrivia(&local_138,alloc,trivia_01);
    goto LAB_001e4054;
  }
  __x = Token::rawText(&local_138);
  __y._M_str = "\\";
  __y._M_len = 1;
  bVar7 = std::operator==(__x,__y);
  if (bVar7) {
LAB_001e3f96:
    SVar11 = Token::location(&local_138);
    addDiag(this,(DiagCode)0x60002,
            (SourceLocation)
            ((long)SVar11 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
            (ulong)(SVar11._0_4_ & 0xfffffff)));
  }
  else {
    __y_00._M_str = "`\\";
    __y_00._M_len = 2;
    bVar7 = std::operator==(__x,__y_00);
    if (bVar7) goto LAB_001e3f96;
    __y_01._M_str = "`";
    __y_01._M_len = 1;
    bVar7 = std::operator==(__x,__y_01);
    if (bVar7) {
      SVar11 = Token::location(&local_138);
      addDiag(this,(DiagCode)0xa0002,SVar11);
    }
  }
  tokens.super_SmallVectorBase<slang::parsing::Token>._0_16_ = Token::trivia(&local_138);
  SmallVectorBase<slang::parsing::Trivia>::
  append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
            (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&tokens);
  alloc = this->alloc;
  iVar8 = SmallVectorBase<slang::parsing::Trivia>::copy
                    (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc,
                     src_00);
  trivia_00._M_ptr._4_4_ = extraout_var_00;
  trivia_00._M_ptr._0_4_ = iVar8;
  trivia_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
  TVar14 = Token::withTrivia(&local_138,alloc,trivia_00);
LAB_001e4054:
  SmallVectorBase<slang::parsing::Trivia>::cleanup
            (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc);
  return TVar14;
}

Assistant:

Token Preprocessor::handleDirectives(Token token) {
    // burn through any preprocessor directives we find and convert them to trivia
    SmallVector<Trivia, 8> trivia;
    while (true) {
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
            case TokenKind::MacroEscapedQuote:
            case TokenKind::MacroPaste:
            case TokenKind::LineContinuation: {
                SmallVector<Token> tokens;
                tokens.push_back(token);
                trivia.push_back(Trivia(TriviaKind::SkippedTokens, tokens.copy(alloc)));
                addDiag(diag::MacroOpsOutsideDefinition, token.range());
                break;
            }
            case TokenKind::Unknown: {
                // This is an error in the lexer. See if we should issue any more
                // specific diagnostics here (that were deferred until we know we're
                // not inside a macro) and then return the token.
                auto raw = token.rawText();
                if (raw == "\\" || raw == "`\\")
                    addDiag(diag::EscapedWhitespace, token.location() + 1);
                else if (raw == "`")
                    addDiag(diag::MisplacedDirectiveChar, token.location());

                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
            }
            case TokenKind::Directive: {
                auto savedLast = std::exchange(lastConsumed, token);
                switch (token.directiveKind()) {
                    case SyntaxKind::IncludeDirective:
                        trivia.push_back(handleIncludeDirective(token));
                        break;
                    case SyntaxKind::ResetAllDirective:
                        trivia.push_back(handleResetAllDirective(token));
                        break;
                    case SyntaxKind::DefineDirective:
                        trivia.push_back(handleDefineDirective(token));
                        break;
                    case SyntaxKind::MacroUsage: {
                        auto [directive, extra] = handleMacroUsage(token);
                        trivia.push_back(directive);
                        if (extra)
                            trivia.push_back(extra);
                        break;
                    }
                    case SyntaxKind::IfDefDirective:
                        trivia.push_back(handleIfDefDirective(token, false));
                        break;
                    case SyntaxKind::IfNDefDirective:
                        trivia.push_back(handleIfDefDirective(token, true));
                        break;
                    case SyntaxKind::ElsIfDirective:
                        trivia.push_back(handleElsIfDirective(token));
                        break;
                    case SyntaxKind::ElseDirective:
                        trivia.push_back(handleElseDirective(token));
                        break;
                    case SyntaxKind::EndIfDirective:
                        trivia.push_back(handleEndIfDirective(token));
                        break;
                    case SyntaxKind::TimeScaleDirective:
                        trivia.push_back(handleTimeScaleDirective(token));
                        break;
                    case SyntaxKind::DefaultNetTypeDirective:
                        trivia.push_back(handleDefaultNetTypeDirective(token));
                        break;
                    case SyntaxKind::LineDirective:
                        trivia.push_back(handleLineDirective(token));
                        break;
                    case SyntaxKind::UndefDirective:
                        trivia.push_back(handleUndefDirective(token));
                        break;
                    case SyntaxKind::UndefineAllDirective:
                        trivia.push_back(handleUndefineAllDirective(token));
                        break;
                    case SyntaxKind::BeginKeywordsDirective:
                        trivia.push_back(handleBeginKeywordsDirective(token));
                        break;
                    case SyntaxKind::EndKeywordsDirective:
                        trivia.push_back(handleEndKeywordsDirective(token));
                        break;
                    case SyntaxKind::PragmaDirective: {
                        auto [directive, skipped] = handlePragmaDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::UnconnectedDriveDirective:
                        trivia.push_back(handleUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        trivia.push_back(handleNoUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::CellDefineDirective:
                        trivia.push_back(handleCellDefineDirective(token));
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        trivia.push_back(handleEndCellDefineDirective(token));
                        break;
                    case SyntaxKind::DefaultDecayTimeDirective:
                        trivia.push_back(handleDefaultDecayTimeDirective(token));
                        break;
                    case SyntaxKind::DefaultTriregStrengthDirective:
                        trivia.push_back(handleDefaultTriregStrengthDirective(token));
                        break;
                    case SyntaxKind::ProtectedDirective: {
                        auto [directive, skipped] = handleProtectedDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::DelayModeDistributedDirective:
                    case SyntaxKind::DelayModePathDirective:
                    case SyntaxKind::DelayModeUnitDirective:
                    case SyntaxKind::DelayModeZeroDirective:
                    case SyntaxKind::ProtectDirective:
                    case SyntaxKind::EndProtectDirective:
                    case SyntaxKind::EndProtectedDirective:
                        // we don't do anything with these directives currently
                        trivia.push_back(createSimpleDirective(token));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
                lastConsumed = savedLast;
                break;
            }
            default:
                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
        }

        token = nextRaw();
    }
}